

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPath.cpp
# Opt level: O3

void __thiscall CppUnit::TestPath::TestPath(TestPath *this,Test *searchRoot,string *pathAsString)

{
  int iVar1;
  Test *pTVar2;
  undefined4 extraout_var;
  ulong uVar3;
  undefined4 extraout_var_00;
  invalid_argument *this_00;
  long *plVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  ulong uVar5;
  size_type *psVar6;
  long *plVar7;
  pointer pcVar8;
  ulong uVar9;
  ulong uVar10;
  int childIndex;
  uint uVar11;
  bool bVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 auStack_c8 [8];
  PathTestNames testNames;
  long *local_50;
  size_t local_48;
  long local_40;
  long lStack_38;
  
  this->_vptr_TestPath = (_func_int **)&PTR__TestPath_00143170;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>::_M_initialize_map
            (&(this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>,0
            );
  testNames.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  testNames.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  testNames.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  testNames.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  testNames.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  testNames.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  testNames.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  testNames.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  auStack_c8 = (undefined1  [8])0x0;
  testNames.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_c8,0);
  pTVar2 = findActualRoot(this,searchRoot,pathAsString,(PathTestNames *)auStack_c8);
  (*this->_vptr_TestPath[3])(this,pTVar2);
  uVar11 = 1;
LAB_0012a4b4:
  uVar5 = (ulong)uVar11;
  if (((long)((long)testNames.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first -
             testNames.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_map_size) >> 5) +
      ((long)testNames.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node -
       (long)testNames.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur >> 5) +
      ((((ulong)((long)testNames.
                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_last -
                (long)testNames.
                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last) >> 3) - 1) +
      (ulong)(testNames.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_last == (_Elt_pointer)0x0)) * 0x10 <=
      uVar5) {
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)auStack_c8);
    return;
  }
  uVar10 = 0;
  do {
    iVar1 = (*pTVar2->_vptr_Test[4])(pTVar2);
    if (iVar1 <= (int)uVar10) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      uVar10 = ((long)(testNames.
                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_map_size -
                      (long)testNames.
                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 5) + uVar5;
      if ((long)uVar10 < 0) {
        uVar5 = (long)uVar10 >> 4;
      }
      else {
        if (uVar10 < 0x10) {
          __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (testNames.
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_map_size + uVar5 * 0x20);
          goto LAB_0012a689;
        }
        uVar5 = uVar10 >> 4;
      }
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((&(testNames.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last)->_M_dataplus)[uVar5]._M_p +
              (uVar10 + uVar5 * -0x10) * 0x20);
LAB_0012a689:
      std::operator+(&local_e8,"TestPath::TestPath(): failed to resolve test name <",__rhs);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_e8);
      local_108._M_dataplus._M_p = (pointer)*plVar4;
      psVar6 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_108._M_dataplus._M_p == psVar6) {
        local_108.field_2._M_allocated_capacity = *psVar6;
        local_108.field_2._8_8_ = plVar4[3];
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      }
      else {
        local_108.field_2._M_allocated_capacity = *psVar6;
      }
      local_108._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::operator+(&local_128,&local_108,pathAsString);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_128);
      local_50 = (long *)*plVar4;
      plVar7 = plVar4 + 2;
      if (local_50 == plVar7) {
        local_40 = *plVar7;
        lStack_38 = plVar4[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *plVar7;
      }
      local_48 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::invalid_argument::invalid_argument(this_00,(string *)&local_50);
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    iVar1 = (*pTVar2->_vptr_Test[5])(pTVar2,uVar10);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x30))
              (&local_50,(long *)CONCAT44(extraout_var,iVar1));
    plVar4 = local_50;
    uVar3 = ((long)(testNames.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map_size -
                   (long)testNames.
                         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 5) + uVar5;
    if ((long)uVar3 < 0) {
      uVar9 = (long)uVar3 >> 4;
LAB_0012a580:
      pcVar8 = (&(testNames.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last)->_M_dataplus)[uVar9]._M_p +
               (uVar3 + uVar9 * -0x10) * 0x20;
    }
    else {
      if (0xf < uVar3) {
        uVar9 = uVar3 >> 4;
        goto LAB_0012a580;
      }
      pcVar8 = (pointer)(testNames.
                         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_map_size + uVar5 * 0x20);
    }
    if (local_48 == *(size_t *)(pcVar8 + 8)) {
      if (local_48 == 0) {
        bVar12 = true;
      }
      else {
        iVar1 = bcmp(local_50,*(void **)pcVar8,local_48);
        bVar12 = iVar1 == 0;
      }
    }
    else {
      bVar12 = false;
    }
    if (plVar4 != &local_40) {
      operator_delete(plVar4,local_40 + 1);
    }
    if (bVar12) break;
    uVar10 = (ulong)((int)uVar10 + 1);
  } while( true );
  iVar1 = (*pTVar2->_vptr_Test[5])(pTVar2,uVar10);
  pTVar2 = (Test *)CONCAT44(extraout_var_00,iVar1);
  (*this->_vptr_TestPath[3])(this,pTVar2);
  uVar11 = uVar11 + 1;
  goto LAB_0012a4b4;
}

Assistant:

TestPath::TestPath( Test *searchRoot, 
                    const std::string &pathAsString )
    : m_tests()
{
  PathTestNames testNames;

  Test *parentTest = findActualRoot( searchRoot, pathAsString, testNames );
  add( parentTest );

  for ( unsigned int index = 1; index < testNames.size(); ++index )
  {
    bool childFound = false;
    for ( int childIndex =0; childIndex < parentTest->getChildTestCount(); ++childIndex )
    {
      if ( parentTest->getChildTestAt( childIndex )->getName() == testNames[index] )
      {
        childFound = true;
        parentTest = parentTest->getChildTestAt( childIndex );
        break;
      }
    }

    if ( !childFound )
      throw std::invalid_argument( "TestPath::TestPath(): failed to resolve test name <"+
                                   testNames[index] + "> of path <" + pathAsString + ">" );

    add( parentTest );
  }
}